

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  Vector<float,_4> *a;
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  BlendCase *pBVar4;
  int extraout_EAX;
  int iVar5;
  RenderTarget *pRVar6;
  undefined8 uVar7;
  QuadRenderer *this_00;
  ReferenceQuadRenderer *this_01;
  TextureLevel *this_02;
  long lVar8;
  TextureFormat local_88;
  undefined8 uStack_80;
  BlendCase *local_78;
  tcu local_70 [16];
  Vector<float,_4> local_60;
  tcu local_50 [16];
  tcu local_40 [16];
  
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = (pRVar6->m_pixelFormat).alphaBits;
  if (init()::baseGradientColors == '\0') {
    iVar5 = __cxa_guard_acquire(&init()::baseGradientColors);
    if (iVar5 != 0) {
      init::baseGradientColors[0].m_data[0] = _DAT_01801840;
      init::baseGradientColors[0].m_data[1] = _UNK_01801844;
      init::baseGradientColors[0].m_data[2] = _UNK_01801848;
      init::baseGradientColors[0].m_data[3] = _UNK_0180184c;
      init::baseGradientColors[1].m_data[0] = _DAT_017eb260;
      init::baseGradientColors[1].m_data[1] = _UNK_017eb264;
      init::baseGradientColors[1].m_data[2] = _UNK_017eb268;
      init::baseGradientColors[1].m_data[3] = _UNK_017eb26c;
      init::baseGradientColors[2].m_data[0] = _DAT_0181c200;
      init::baseGradientColors[2].m_data[1] = _UNK_0181c204;
      init::baseGradientColors[2].m_data[2] = _UNK_0181c208;
      init::baseGradientColors[2].m_data[3] = _UNK_0181c20c;
      init::baseGradientColors[3].m_data[0] = _DAT_01818ed0;
      init::baseGradientColors[3].m_data[1] = _UNK_01818ed4;
      init::baseGradientColors[3].m_data[2] = _UNK_01818ed8;
      init::baseGradientColors[3].m_data[3] = _UNK_01818edc;
      __cxa_guard_release(&init()::baseGradientColors);
    }
  }
  local_78 = this;
  for (lVar8 = 0; pBVar4 = local_78, lVar8 != 0x40; lVar8 = lVar8 + 0x10) {
    a = (Vector<float,_4> *)((long)init::baseGradientColors[0].m_data + lVar8);
    tcu::operator-(local_40,a,0.5);
    tcu::operator*(local_70,0.2,(Vector<float,_4> *)local_40);
    tcu::operator+((tcu *)&local_88,0.5,(Vector<float,_4> *)local_70);
    puVar1 = (undefined8 *)((long)(this->m_firstQuad).color[0].m_data + lVar8);
    *puVar1 = CONCAT44(local_88.type,local_88.order);
    puVar1[1] = uStack_80;
    puVar1 = (undefined8 *)((long)(this->m_firstQuad).color[0].m_data + lVar8);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)(this->m_firstQuadInt).color[0].m_data + lVar8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    tcu::Vector<float,_4>::Vector(&local_60,1.0);
    tcu::operator-(local_50,&local_60,a);
    tcu::operator-(local_40,(Vector<float,_4> *)local_50,0.5);
    tcu::operator*(local_70,1.0,(Vector<float,_4> *)local_40);
    tcu::operator+((tcu *)&local_88,0.5,(Vector<float,_4> *)local_70);
    puVar1 = (undefined8 *)((long)(this->m_secondQuad).color[0].m_data + lVar8);
    *puVar1 = CONCAT44(local_88.type,local_88.order);
    puVar1[1] = uStack_80;
    puVar1 = (undefined8 *)((long)(this->m_secondQuad).color[0].m_data + lVar8);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)(this->m_secondQuadInt).color[0].m_data + lVar8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
  }
  pRVar6 = Context::getRenderTarget((local_78->super_TestCase).m_context);
  iVar5 = pRVar6->m_width;
  if (0x3f < pRVar6->m_width) {
    iVar5 = 0x40;
  }
  pBVar4->m_viewportW = iVar5;
  pRVar6 = Context::getRenderTarget((pBVar4->super_TestCase).m_context);
  iVar5 = 0x40;
  if (pRVar6->m_height < 0x40) {
    iVar5 = pRVar6->m_height;
  }
  pBVar4->m_viewportH = iVar5;
  *(undefined8 *)(pBVar4->m_firstQuadInt).posA.m_data = 0;
  *(undefined8 *)(pBVar4->m_secondQuadInt).posA.m_data = 0;
  uVar7 = CONCAT44(iVar5 + -1,pBVar4->m_viewportW + -1);
  *(undefined8 *)(pBVar4->m_firstQuadInt).posB.m_data = uVar7;
  *(undefined8 *)(pBVar4->m_secondQuadInt).posB.m_data = uVar7;
  this_00 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_00,((pBVar4->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_100_ES);
  pBVar4->m_renderer = this_00;
  this_01 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_01);
  pBVar4->m_referenceRenderer = this_01;
  this_02 = (TextureLevel *)operator_new(0x28);
  local_88.order = RGBA - (iVar3 == 0);
  local_88.type = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(this_02,&local_88,pBVar4->m_viewportW,pBVar4->m_viewportH,1);
  pBVar4->m_refColorBuffer = this_02;
  pBVar4->m_curParamSetNdx = 0;
  return extraout_EAX;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportW = de::min<int>(m_context.getRenderTarget().getWidth(),	MAX_VIEWPORT_WIDTH);
	m_viewportH = de::min<int>(m_context.getRenderTarget().getHeight(),	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,					0);
	m_secondQuadInt.posA	= tcu::IVec2(0,					0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportW-1,		m_viewportH-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportW-1,		m_viewportH-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportW, m_viewportH);

	m_curParamSetNdx = 0;
}